

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

void __thiscall procxx::pipe_streambuf::flush(pipe_streambuf *this)

{
  long lVar1;
  pipe_end pVar2;
  size_t in_RCX;
  
  pVar2 = pipe_t::write_end();
  if ((this->stdin_pipe_).pipe_._M_elems[pVar2.end_] != -1) {
    lVar1 = *(long *)&(this->super_pipe_ostreambuf).field_0x20;
    pipe_t::write(&this->stdin_pipe_,(int)lVar1,
                  (void *)(*(long *)&(this->super_pipe_ostreambuf).field_0x28 - lVar1),in_RCX);
    lVar1 = *(long *)&(this->super_pipe_ostreambuf).field_0x28;
    *(long *)&(this->super_pipe_ostreambuf).field_0x28 =
         (*(int *)&(this->super_pipe_ostreambuf).field_0x20 - (int)lVar1) + lVar1;
  }
  return;
}

Assistant:

void flush() override {
    if (stdin_pipe_.open(pipe_t::write_end())) {
      stdin_pipe_.write(pbase(), static_cast<std::size_t>(pptr() - pbase()));
      pbump(static_cast<int>(-(pptr() - pbase())));
    }
  }